

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::~CTcMake(CTcMake *this)

{
  void *pvVar1;
  CTcMakeModule *pCVar2;
  CTcMakePath *pCVar3;
  CTcMakeDef *pCVar4;
  long in_RDI;
  CTcMakeDef *nxt_3;
  CTcMakePath *nxt_2;
  CTcMakePath *nxt_1;
  CTcMakeModule *nxt;
  CTcMakeModule *in_stack_ffffffffffffff90;
  CTcMakeDef *this_00;
  
  while (*(long *)(in_RDI + 0x30) != 0) {
    pCVar2 = CTcMakeModule::get_next(*(CTcMakeModule **)(in_RDI + 0x30));
    pvVar1 = *(void **)(in_RDI + 0x30);
    if (pvVar1 != (void *)0x0) {
      CTcMakeModule::~CTcMakeModule(in_stack_ffffffffffffff90);
      operator_delete(pvVar1,0x68);
    }
    *(CTcMakeModule **)(in_RDI + 0x30) = pCVar2;
  }
  while (*(long *)(in_RDI + 0x58) != 0) {
    pCVar3 = CTcMakePath::get_next(*(CTcMakePath **)(in_RDI + 0x58));
    pvVar1 = *(void **)(in_RDI + 0x58);
    if (pvVar1 != (void *)0x0) {
      CTcMakePath::~CTcMakePath((CTcMakePath *)0x206816);
      operator_delete(pvVar1,0x10);
    }
    *(CTcMakePath **)(in_RDI + 0x58) = pCVar3;
  }
  while (*(long *)(in_RDI + 0x40) != 0) {
    pCVar3 = CTcMakePath::get_next(*(CTcMakePath **)(in_RDI + 0x40));
    pvVar1 = *(void **)(in_RDI + 0x40);
    if (pvVar1 != (void *)0x0) {
      CTcMakePath::~CTcMakePath((CTcMakePath *)0x206880);
      operator_delete(pvVar1,0x10);
    }
    *(CTcMakePath **)(in_RDI + 0x40) = pCVar3;
  }
  while (*(long *)(in_RDI + 0x70) != 0) {
    pCVar4 = CTcMakeDef::get_next(*(CTcMakeDef **)(in_RDI + 0x70));
    this_00 = *(CTcMakeDef **)(in_RDI + 0x70);
    if (this_00 != (CTcMakeDef *)0x0) {
      CTcMakeDef::~CTcMakeDef(this_00);
      operator_delete(this_00,0x20);
    }
    *(CTcMakeDef **)(in_RDI + 0x70) = pCVar4;
  }
  lib_free_str((char *)0x206916);
  CVmObjBigNum::term_cache();
  CTcMakeStr::~CTcMakeStr((CTcMakeStr *)0x20692d);
  CTcMakeStr::~CTcMakeStr((CTcMakeStr *)0x20693b);
  CTcMakeStr::~CTcMakeStr((CTcMakeStr *)0x206949);
  return;
}

Assistant:

CTcMake::~CTcMake()
{
    /* delete the modules */
    while (mod_head_ != 0)
    {
        CTcMakeModule *nxt;

        /* remember the next module */
        nxt = mod_head_->get_next();

        /* delete this one */
        delete mod_head_;

        /* move on to the next one */
        mod_head_ = nxt;
    }

    /* delete the #include path list */
    while (inc_head_ != 0)
    {
        CTcMakePath *nxt;

        /* remember the next one */
        nxt = inc_head_->get_next();

        /* delete this one */
        delete inc_head_;

        /* move on to the next one */
        inc_head_ = nxt;
    }

    /* delete the source path list */
    while (src_head_ != 0)
    {
        CTcMakePath *nxt;

        /* remember the next one */
        nxt = src_head_->get_next();

        /* delete this one */
        delete src_head_;

        /* move on to the next one */
        src_head_ = nxt;
    }

    /* delete the preprocessor symbol list */
    while (def_head_ != 0)
    {
        CTcMakeDef *nxt;

        /* remember the next one */
        nxt = def_head_->get_next();

        /* delete this one */
        delete def_head_;

        /* move on to the next one */
        def_head_ = nxt;
    }

    /* delete the source character set name */
    lib_free_str(source_charset_);

    /* delete the BigNumber cache */
    CVmObjBigNum::term_cache();
}